

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O1

bool __thiscall
wallet::SQLiteBatch::ExecStatement(SQLiteBatch *this,sqlite3_stmt *stmt,Span<const_std::byte> blob)

{
  bool bVar1;
  int iVar2;
  char (*args) [14];
  void *__stat_loc;
  string *in_R9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  Span<const_std::byte> blob_00;
  long *plVar3;
  char **in_stack_ffffffffffffffb0;
  long local_48 [2];
  long local_38;
  
  blob_00.m_data = (byte *)blob.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_database->m_db != (sqlite3 *)0x0) {
    if (stmt == (sqlite3_stmt *)0x0) {
      __assert_fail("stmt",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x207,
                    "bool wallet::SQLiteBatch::ExecStatement(sqlite3_stmt *, Span<const std::byte>)"
                   );
    }
    plVar3 = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffffa8,"key","");
    __stat_loc = (void *)0x1;
    blob_00.m_size = (size_t)&stack0xffffffffffffffa8;
    bVar1 = BindBlobToStatement((wallet *)stmt,(sqlite3_stmt *)0x1,(int)blob.m_data,blob_00,in_R9);
    if (plVar3 != local_48) {
      __stat_loc = (void *)(local_48[0] + 1);
      operator_delete(plVar3,(ulong)__stat_loc);
    }
    if (bVar1) {
      if (this->m_txn == false) {
        CSemaphore::wait(&this->m_database->m_write_semaphore,__stat_loc);
      }
      iVar2 = sqlite3_step(stmt);
      sqlite3_clear_bindings(stmt);
      sqlite3_reset(stmt);
      bVar1 = iVar2 == 0x65;
      if (!bVar1) {
        args = (char (*) [14])sqlite3_errstr(iVar2);
        logging_function._M_str = "ExecStatement";
        logging_function._M_len = 0xd;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
        ;
        source_file._M_len = 0x5a;
        LogPrintf_<char[14],char_const*>
                  (logging_function,source_file,0x214,
                   IPC|COINDB|LIBEVENT|MEMPOOLREJ|RAND|SELECTCOINS|RPC|WALLETDB|BENCH,0x8725be,
                   &stack0xffffffffffffffa8,args,in_stack_ffffffffffffffb0);
      }
      if (this->m_txn == false) {
        CSemaphore::post(&this->m_database->m_write_semaphore);
      }
      goto LAB_00581349;
    }
  }
  bVar1 = false;
LAB_00581349:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::ExecStatement(sqlite3_stmt* stmt, Span<const std::byte> blob)
{
    if (!m_database.m_db) return false;
    assert(stmt);

    // Bind: leftmost parameter in statement is index 1
    if (!BindBlobToStatement(stmt, 1, blob, "key")) return false;

    // Acquire semaphore if not previously acquired when creating a transaction.
    if (!m_txn) m_database.m_write_semaphore.wait();

    // Execute
    int res = sqlite3_step(stmt);
    sqlite3_clear_bindings(stmt);
    sqlite3_reset(stmt);
    if (res != SQLITE_DONE) {
        LogPrintf("%s: Unable to execute statement: %s\n", __func__, sqlite3_errstr(res));
    }

    if (!m_txn) m_database.m_write_semaphore.post();

    return res == SQLITE_DONE;
}